

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::CoreMLModels::WordTagger::clear_Tags(WordTagger *this)

{
  if ((this->_oneof_case_[0] == 200) && ((this->Tags_).stringtags_ != (StringVector *)0x0)) {
    (*(((this->Tags_).stringtags_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void WordTagger::clear_Tags() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.WordTagger)
  switch (Tags_case()) {
    case kStringTags: {
      delete Tags_.stringtags_;
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TAGS_NOT_SET;
}